

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_random.cpp
# Opt level: O3

Reals __thiscall
Omega_h::unit_uniform_random_reals_from_globals(Omega_h *this,GOs *globals,I64 seed,I64 counter)

{
  int *piVar1;
  ulong uVar2;
  int iVar3;
  Alloc *pAVar4;
  _Alloc_hider _Var5;
  ulong **__dest;
  long *plVar6;
  undefined8 *puVar7;
  ulong *puVar8;
  ulong uVar9;
  ulong uVar10;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *pvVar11;
  Alloc *pAVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  int size_in;
  size_t sVar20;
  uint uVar21;
  ulong uVar22;
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  Reals RVar26;
  ScopedTimer omega_h_scoped_function_timer;
  Write<double> out;
  size_type __dnew;
  type functor;
  ScopedTimer local_141;
  Alloc *local_140;
  Alloc *local_138;
  ulong local_130;
  Write<double> local_128;
  ulong *local_118;
  long local_110;
  ulong local_108 [2];
  long *local_f8;
  undefined8 local_f0;
  long local_e8;
  undefined8 uStack_e0;
  string local_d8;
  Alloc *local_b8;
  void *local_b0;
  ulong *local_a8;
  long local_a0;
  ulong local_98;
  long lStack_90;
  Write<double> local_88;
  ulong **local_78;
  ulong *local_70;
  ulong *local_68 [2];
  Alloc *local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  void *local_38;
  
  pAVar12 = (globals->write_).shared_alloc_.alloc;
  if (((ulong)pAVar12 & 1) == 0) {
    sVar20 = pAVar12->size;
  }
  else {
    sVar20 = (ulong)pAVar12 >> 3;
  }
  local_130 = seed;
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"");
  size_in = (int)(sVar20 >> 3);
  Write<double>::Write(&local_128,size_in,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  pvVar11 = local_128.shared_alloc_.direct_ptr;
  local_d8._M_dataplus._M_p = (pointer)(globals->write_).shared_alloc_.alloc;
  if (((ulong)local_d8._M_dataplus._M_p & 7) == 0 &&
      (Alloc *)local_d8._M_dataplus._M_p != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_d8._M_dataplus._M_p = (pointer)(((Alloc *)local_d8._M_dataplus._M_p)->size * 8 + 1);
    }
    else {
      ((Alloc *)local_d8._M_dataplus._M_p)->use_count =
           ((Alloc *)local_d8._M_dataplus._M_p)->use_count + 1;
    }
  }
  local_d8._M_string_length = (size_type)(globals->write_).shared_alloc_.direct_ptr;
  local_d8.field_2._M_allocated_capacity = local_130;
  local_b8 = local_128.shared_alloc_.alloc;
  if (((ulong)local_128.shared_alloc_.alloc & 7) == 0 &&
      local_128.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_b8 = (Alloc *)((local_128.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_128.shared_alloc_.alloc)->use_count = (local_128.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_b0 = local_128.shared_alloc_.direct_ptr;
  local_78 = local_68;
  local_118 = (ulong *)0x5d;
  local_140 = local_b8;
  local_138 = (Alloc *)local_d8._M_dataplus._M_p;
  local_d8.field_2._8_8_ = counter;
  local_58 = (Alloc *)this;
  local_38 = (void *)local_d8._M_string_length;
  __dest = (ulong **)std::__cxx11::string::_M_create((ulong *)&local_78,(ulong)&local_118);
  puVar8 = local_118;
  local_68[0] = local_118;
  local_78 = __dest;
  memcpy(__dest,
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_for.hpp"
         ,0x5d);
  local_70 = puVar8;
  *(undefined1 *)((long)__dest + (long)puVar8) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_78);
  puVar8 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar8) {
    local_98 = *puVar8;
    lStack_90 = plVar6[3];
    local_a8 = &local_98;
  }
  else {
    local_98 = *puVar8;
    local_a8 = (ulong *)*plVar6;
  }
  local_a0 = plVar6[1];
  *plVar6 = (long)puVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_118 = local_108;
  std::__cxx11::string::_M_construct((ulong)&local_118,'\x02');
  *(undefined2 *)local_118 = 0x3438;
  uVar10 = 0xf;
  if (local_a8 != &local_98) {
    uVar10 = local_98;
  }
  if (uVar10 < (ulong)(local_110 + local_a0)) {
    uVar10 = 0xf;
    if (local_118 != local_108) {
      uVar10 = local_108[0];
    }
    if ((ulong)(local_110 + local_a0) <= uVar10) {
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_118,0,(char *)0x0,(ulong)local_a8);
      goto LAB_004399f3;
    }
  }
  puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_118);
LAB_004399f3:
  local_f8 = &local_e8;
  plVar6 = puVar7 + 2;
  if ((long *)*puVar7 == plVar6) {
    local_e8 = *plVar6;
    uStack_e0 = puVar7[3];
  }
  else {
    local_e8 = *plVar6;
    local_f8 = (long *)*puVar7;
  }
  local_f0 = puVar7[1];
  *puVar7 = plVar6;
  puVar7[1] = 0;
  *(undefined1 *)plVar6 = 0;
  begin_code("parallel_for",(char *)local_f8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8,local_e8 + 1);
  }
  if (local_118 != local_108) {
    operator_delete(local_118,local_108[0] + 1);
  }
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98 + 1);
  }
  pAVar12 = local_138;
  if (local_78 != local_68) {
    operator_delete(local_78,(long)local_68[0] + 1);
  }
  if (0 < size_in) {
    if (((ulong)pAVar12 & 7) == 0 && pAVar12 != (Alloc *)0x0) {
      pAVar12 = (Alloc *)(pAVar12->size * 8 + 1);
    }
    if (((ulong)local_140 & 7) == 0 && local_140 != (Alloc *)0x0) {
      local_140 = (Alloc *)(local_140->size * 8 + 1);
    }
    pAVar4 = local_140;
    entering_parallel = '\0';
    uVar10 = ((ulong)counter >> 1 & 0xffffffff) * 0xd2511f53;
    uVar22 = (local_130 & 0xffffffff) * 0xcd9e8d57;
    local_40 = uVar22 >> 0x20;
    local_48 = uVar10 & 0xffffffff;
    local_50 = counter & 0xfffffffffffffffe;
    lVar17 = 0;
    do {
      uVar2 = *(ulong *)((long)local_38 + lVar17 * 8);
      dVar23 = 0.0;
      uVar21 = (uint)uVar22;
      iVar3 = (int)uVar2;
      uVar9 = counter;
      if ((counter & 1U) != 0) {
        uVar14 = (uVar2 & 0xffffffff ^ (ulong)counter >> 0x21 ^ local_40) * 0xd2511f53;
        lVar13 = ((uVar10 ^ local_130 ^ uVar2) >> 0x20) * 0xcd9e8d57;
        lVar18 = ((uVar2 + 0xbb67ae8500000000 ^ uVar14) >> 0x20 ^ local_48) * 0xcd9e8d57;
        uVar9 = (ulong)(uVar21 ^ iVar3 + 0x9e3779b9U ^ (uint)((ulong)lVar13 >> 0x20)) * 0xd2511f53;
        lVar15 = (uVar14 & 0xffffffff ^ (uVar2 + 0x76cf5d0a00000000 ^ uVar9) >> 0x20) * 0xcd9e8d57;
        uVar14 = (ulong)((uint)lVar13 ^ iVar3 + 0x3c6ef372U ^ (uint)((ulong)lVar18 >> 0x20)) *
                 0xd2511f53;
        lVar13 = (uVar9 & 0xffffffff ^ (uVar2 + 0x32370b8f00000000 ^ uVar14) >> 0x20) * 0xcd9e8d57;
        uVar9 = (ulong)((uint)lVar18 ^ iVar3 + 0xdaa66d2bU ^ (uint)((ulong)lVar15 >> 0x20)) *
                0xd2511f53;
        lVar18 = (uVar14 & 0xffffffff ^ (uVar2 + 0xed9eba1400000000 ^ uVar9) >> 0x20) * 0xcd9e8d57;
        uVar14 = (ulong)((uint)lVar15 ^ iVar3 + 0x78dde6e4U ^ (uint)((ulong)lVar13 >> 0x20)) *
                 0xd2511f53;
        lVar15 = (uVar9 & 0xffffffff ^ (uVar2 + 0xa906689900000000 ^ uVar14) >> 0x20) * 0xcd9e8d57;
        uVar9 = (ulong)((uint)lVar13 ^ iVar3 + 0x1715609dU ^ (uint)((ulong)lVar18 >> 0x20)) *
                0xd2511f53;
        lVar13 = (uVar14 & 0xffffffff ^ (uVar2 + 0x646e171e00000000 ^ uVar9) >> 0x20) * 0xcd9e8d57;
        uVar9 = (ulong)((uint)lVar13 ^ iVar3 + 0xf1bbcdc8U ^
                       (uint)((uVar9 & 0xffffffff ^
                              ((ulong)((uint)lVar18 ^ iVar3 + 0xb54cda56U ^
                                      (uint)((ulong)lVar15 >> 0x20)) * 0xd2511f53 ^
                              uVar2 + 0x1fd5c5a300000000) >> 0x20) * 0xcd9e8d57 >> 0x20));
        lVar18 = uVar9 * -0x2daee0ad00000000;
        auVar24._8_4_ = (int)((ulong)lVar18 >> 0x20);
        auVar24._0_8_ = lVar18;
        auVar24._12_4_ = 0x45300000;
        dVar23 = ((auVar24._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,
                                   (uint)(uVar9 * 0xd2511f53 >> 0x20) ^
                                   (uint)(uVar2 + 0x96a522ad00000000 >> 0x20) ^
                                   ((uint)lVar15 ^ iVar3 + 0x5384540fU ^
                                   (uint)((ulong)lVar13 >> 0x20)) * -0x2daee0ad) -
                 4503599627370496.0)) * 5.421010862427522e-20;
        uVar9 = local_50;
      }
      if ((uVar9 & 1) == 0) {
        uVar14 = (uVar9 >> 1 & 0xffffffff) * 0xd2511f53;
        lVar18 = ((uVar2 ^ local_130 ^ uVar14) >> 0x20) * 0xcd9e8d57;
        uVar16 = (uVar9 >> 0x21 ^ local_40 ^ uVar2 & 0xffffffff) * 0xd2511f53;
        lVar13 = (uVar14 & 0xffffffff ^ (uVar2 + 0xbb67ae8500000000 ^ uVar16) >> 0x20) * 0xcd9e8d57;
        uVar9 = (ulong)(uVar21 ^ iVar3 + 0x9e3779b9U ^ (uint)((ulong)lVar18 >> 0x20)) * 0xd2511f53;
        lVar15 = (uVar16 & 0xffffffff ^ (uVar2 + 0x76cf5d0a00000000 ^ uVar9) >> 0x20) * 0xcd9e8d57;
        uVar14 = (ulong)((uint)lVar18 ^ iVar3 + 0x3c6ef372U ^ (uint)((ulong)lVar13 >> 0x20)) *
                 0xd2511f53;
        lVar18 = (uVar9 & 0xffffffff ^ (uVar2 + 0x32370b8f00000000 ^ uVar14) >> 0x20) * 0xcd9e8d57;
        uVar9 = (ulong)((uint)lVar13 ^ iVar3 + 0xdaa66d2bU ^ (uint)((ulong)lVar15 >> 0x20)) *
                0xd2511f53;
        lVar19 = (uVar14 & 0xffffffff ^ (uVar2 + 0xed9eba1400000000 ^ uVar9) >> 0x20) * 0xcd9e8d57;
        uVar14 = (ulong)((uint)lVar15 ^ iVar3 + 0x78dde6e4U ^ (uint)((ulong)lVar18 >> 0x20)) *
                 0xd2511f53;
        lVar13 = (uVar9 & 0xffffffff ^ (uVar2 + 0xa906689900000000 ^ uVar14) >> 0x20) * 0xcd9e8d57;
        uVar9 = (ulong)((uint)lVar18 ^ iVar3 + 0x1715609dU ^ (uint)((ulong)lVar19 >> 0x20)) *
                0xd2511f53;
        uVar16 = (ulong)((uint)lVar19 ^ iVar3 + 0xb54cda56U ^ (uint)((ulong)lVar13 >> 0x20)) *
                 0xd2511f53;
        uVar14 = uVar16 & 0xffffffff ^
                 ((ulong)((uint)lVar13 ^ iVar3 + 0x5384540fU ^
                         (uint)((uVar14 & 0xffffffff ^ (uVar2 + 0x646e171e00000000 ^ uVar9) >> 0x20)
                                * 0xcd9e8d57 >> 0x20)) * 0xd2511f53 ^ uVar2 + 0xdb3d742800000000) >>
                 0x20;
        lVar13 = uVar14 * -0x326172a900000000;
        auVar25._8_4_ = (int)((ulong)lVar13 >> 0x20);
        auVar25._0_8_ = lVar13;
        auVar25._12_4_ = 0x45300000;
        dVar23 = ((auVar25._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,
                                   iVar3 + 0x8ff34781U ^
                                   ((uint)(uVar2 + 0x1fd5c5a300000000 >> 0x20) ^
                                    (uint)(uVar16 >> 0x20) ^ (uint)uVar9) * -0x326172a9 ^
                                   (uint)(uVar14 * 0xcd9e8d57 >> 0x20)) - 4503599627370496.0)) *
                 5.421010862427522e-20;
      }
      *(double *)((long)pvVar11 + lVar17 * 8) = dVar23;
      lVar17 = lVar17 + 1;
    } while (size_in != (int)lVar17);
    local_138 = pAVar12;
    if (((ulong)local_140 & 7) == 0 && local_140 != (Alloc *)0x0) {
      piVar1 = &local_140->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_140);
        operator_delete(pAVar4,0x48);
      }
    }
    pAVar12 = local_138;
    if (((ulong)local_138 & 7) == 0 && local_138 != (Alloc *)0x0) {
      piVar1 = &local_138->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_138);
        operator_delete(pAVar12,0x48);
      }
    }
  }
  ScopedTimer::~ScopedTimer(&local_141);
  pAVar12 = local_58;
  local_88.shared_alloc_.alloc = local_128.shared_alloc_.alloc;
  if (((ulong)local_128.shared_alloc_.alloc & 7) == 0 &&
      local_128.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_88.shared_alloc_.alloc = (Alloc *)((local_128.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_128.shared_alloc_.alloc)->use_count = (local_128.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_88.shared_alloc_.direct_ptr = local_128.shared_alloc_.direct_ptr;
  Read<double>::Read((Read<signed_char> *)local_58,&local_88);
  pAVar4 = local_88.shared_alloc_.alloc;
  pvVar11 = extraout_RDX;
  if (((ulong)local_88.shared_alloc_.alloc & 7) == 0 && local_88.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_88.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_88.shared_alloc_.alloc);
      operator_delete(pAVar4,0x48);
      pvVar11 = extraout_RDX_00;
    }
  }
  pAVar4 = local_b8;
  if (((ulong)local_b8 & 7) == 0 && local_b8 != (Alloc *)0x0) {
    piVar1 = &local_b8->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_b8);
      operator_delete(pAVar4,0x48);
      pvVar11 = extraout_RDX_01;
    }
  }
  _Var5._M_p = local_d8._M_dataplus._M_p;
  if (((ulong)local_d8._M_dataplus._M_p & 7) == 0 &&
      (Alloc *)local_d8._M_dataplus._M_p != (Alloc *)0x0) {
    piVar1 = (int *)(local_d8._M_dataplus._M_p + 0x30);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc((Alloc *)local_d8._M_dataplus._M_p);
      operator_delete(_Var5._M_p,0x48);
      pvVar11 = extraout_RDX_02;
    }
  }
  if (((ulong)local_128.shared_alloc_.alloc & 7) == 0 &&
      local_128.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_128.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_128.shared_alloc_.alloc);
      operator_delete(local_128.shared_alloc_.alloc,0x48);
      pvVar11 = extraout_RDX_03;
    }
  }
  RVar26.write_.shared_alloc_.direct_ptr = pvVar11;
  RVar26.write_.shared_alloc_.alloc = pAVar12;
  return (Reals)RVar26.write_.shared_alloc_;
}

Assistant:

Reals unit_uniform_random_reals_from_globals(
    GOs const globals, I64 const seed, I64 const counter) {
  auto const n = globals.size();
  auto const out = Write<Real>(n);
  auto functor = OMEGA_H_LAMBDA(LO const i) {
    auto const global = globals[i];
    UnitUniformDistribution distrib(seed, global, counter);
    out[i] = distrib();
  };
  parallel_for(n, std::move(functor));
  return out;
}